

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,InternalString *key,RegexStats **value)

{
  BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  long lVar2;
  char *addr;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  char16_t *pcVar12;
  uint uVar13;
  ulong uVar14;
  char16_t *string1;
  uint uVar15;
  uint uVar16;
  hash_t local_44;
  
  lVar10 = *(long *)this;
  if (lVar10 == 0) {
    BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar10 = *(long *)this;
  }
  if ((ulong)key->m_charLength == 0) {
    uVar11 = 0x2393b8b;
  }
  else {
    uVar11 = 0x811c9dc5;
    uVar9 = 0;
    do {
      uVar13 = *(ushort *)
                ((long)(key->m_content).ptr + uVar9 * 2 + (ulong)((uint)key->m_offset * 2)) ^ uVar11
      ;
      uVar11 = uVar13 * 0x1000193;
      uVar9 = uVar9 + 1;
    } while (key->m_charLength != uVar9);
    uVar11 = uVar13 * 0x2000326 + 1;
  }
  local_44 = PrimePolicy::ModPrime(uVar11 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar10 + (ulong)local_44 * 4);
  if ((int)uVar13 < 0) {
    uVar16 = 0;
  }
  else {
    lVar10 = *(long *)(this + 8);
    uVar16 = 0;
    puVar7 = (undefined4 *)__tls_get_addr();
    do {
      uVar9 = (ulong)uVar13;
      uVar8 = (ulong)*(uint *)(lVar10 + 0x10 + uVar9 * 0x28);
      if (uVar8 == 0) {
        uVar13 = 0x2393b8b;
      }
      else {
        uVar13 = 0x811c9dc5;
        uVar14 = 0;
        do {
          uVar15 = *(ushort *)
                    ((ulong)((uint)*(byte *)(lVar10 + 0x14 + uVar9 * 0x28) * 2) +
                     *(long *)(lVar10 + 0x18 + uVar9 * 0x28) + uVar14 * 2) ^ uVar13;
          uVar13 = uVar15 * 0x1000193;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
        uVar13 = uVar15 * 0x2000326 + 1;
      }
      lVar2 = lVar10 + uVar9 * 0x28;
      if (uVar13 != *(uint *)(lVar2 + 0x20)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar4) goto LAB_00efd83c;
        *puVar7 = 0;
        uVar13 = *(uint *)(lVar2 + 0x20);
      }
      if ((uVar13 == uVar11) && (*(uint *)(lVar2 + 0x10) == key->m_charLength)) {
        string1 = (char16_t *)((ulong)((uint)*(byte *)(lVar2 + 0x14) * 2) + *(long *)(lVar2 + 0x18))
        ;
        pcVar12 = (char16_t *)((ulong)((uint)key->m_offset * 2) + (long)(key->m_content).ptr);
        if ((string1 == pcVar12) ||
           (iVar5 = PAL_wmemcmp(string1,pcVar12,(ulong)*(uint *)(lVar2 + 0x10)), iVar5 == 0)) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar16);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
          if (bVar4) {
            *puVar7 = 0;
            return -1;
          }
          goto LAB_00efd83c;
        }
      }
      uVar16 = uVar16 + 1;
      uVar13 = *(uint *)(lVar2 + 8);
    } while (-1 < (int)uVar13);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar16);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar6 = *(int *)(this + 0x18);
    iVar5 = *(int *)(this + 0x20);
    if (iVar5 == iVar6) {
      BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_44 = PrimePolicy::ModPrime(uVar11 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar6 = *(int *)(this + 0x18);
      iVar5 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar5 + 1;
    if (iVar6 < iVar5 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar4) goto LAB_00efd83c;
      *puVar7 = 0;
      iVar6 = *(int *)(this + 0x18);
    }
    if (iVar6 <= iVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar4) goto LAB_00efd83c;
      *puVar7 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar4) goto LAB_00efd83c;
      *puVar7 = 0;
    }
    iVar5 = *(int *)(this + 0x24);
    if (iVar5 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar4) goto LAB_00efd83c;
      *puVar7 = 0;
      iVar5 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar4) {
LAB_00efd83c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      iVar5 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar6 = BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar5 * 0x28 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar6;
    }
  }
  addr = (char *)(*(long *)(this + 8) + 0x18 + (long)iVar5 * 0x28);
  *(RegexStats **)(addr + -0x18) = *value;
  *(Type *)(addr + -8) = key->m_charLength;
  addr[-4] = key->m_offset;
  pcVar12 = (key->m_content).ptr;
  Memory::Recycler::WBSetBit(addr);
  *(char16_t **)addr = pcVar12;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  *(uint *)(addr + 8) = uVar11;
  lVar10 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  *(undefined4 *)(lVar2 + 8 + (long)iVar5 * 0x28) = *(undefined4 *)(lVar10 + (ulong)local_44 * 4);
  *(int *)(lVar10 + (ulong)local_44 * 4) = iVar5;
  uVar16 = 0;
  iVar6 = iVar5;
  do {
    iVar6 = *(int *)(lVar2 + 8 + (long)iVar6 * 0x28);
    uVar16 = uVar16 + 1;
  } while (iVar6 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar16);
  }
  return iVar5;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }